

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetDebugReadMemoryPrologue
          (ZETParameterValidation *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread,
          zet_debug_memory_space_desc_t *desc,size_t size,void *buffer)

{
  ze_result_t zVar1;
  
  if (hDebug == (zet_debug_session_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  if ((buffer != (void *)0x0 && desc != (zet_debug_memory_space_desc_t *)0x0) &&
     (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, (int)desc->type < 3)) {
    zVar1 = ParameterValidation::validateExtensions<_zet_debug_memory_space_desc_t_const*>(desc);
    return zVar1;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetDebugReadMemoryPrologue(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread,                      ///< [in] the thread identifier.
        const zet_debug_memory_space_desc_t* desc,      ///< [in] memory space descriptor
        size_t size,                                    ///< [in] the number of bytes to read
        void* buffer                                    ///< [in,out] a buffer to hold a copy of the memory
        )
    {
        if( nullptr == hDebug )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == buffer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZET_DEBUG_MEMORY_SPACE_TYPE_ELF < desc->type )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }